

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackCheck.cpp
# Opt level: O2

Expression * __thiscall
wasm::EnforceStackLimits::stackBoundsCheck
          (EnforceStackLimits *this,Function *func,Expression *value)

{
  char *pcVar1;
  Builder *pBVar2;
  size_t sVar3;
  Builder *this_00;
  string_view name;
  Index index;
  BinaryOp BVar4;
  Call *pCVar5;
  LocalSet *left;
  GlobalGet *pGVar6;
  LocalGet *pLVar7;
  Binary *pBVar8;
  If *any;
  GlobalSet *append;
  Block *pBVar9;
  Type in_R8;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  optional<wasm::Type> type;
  LocalGet *local_70;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_68;
  Call *local_50;
  Index local_44;
  Binary *local_40;
  allocator_type local_31;
  
  index = Builder::addVar(func,(Type)(this->stackPointer->type).id);
  pcVar1 = (this->handler).super_IString.str._M_str;
  if (pcVar1 == (char *)0x0) {
    local_50 = (Call *)Builder::makeUnreachable(this->builder);
  }
  else {
    pBVar2 = this->builder;
    sVar3 = (this->handler).super_IString.str._M_len;
    local_40 = (Binary *)value;
    local_70 = Builder::makeLocalGet(pBVar2,index,(Type)(this->stackPointer->type).id);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_70;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_68,__l,
               &local_31);
    in_R8.id = (this->stackPointer->type).id;
    target.super_IString.str._M_str = pcVar1;
    target.super_IString.str._M_len = sVar3;
    pCVar5 = Builder::makeCall(pBVar2,target,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &local_68,in_R8,false);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              (&local_68);
    value = (Expression *)local_40;
    local_50 = pCVar5;
  }
  pBVar2 = this->builder;
  BVar4 = Abstract::getBinary((Type)(this->stackPointer->type).id,GtU);
  left = Builder::makeLocalTee(this->builder,index,value,(Type)(this->stackPointer->type).id);
  pGVar6 = Builder::makeGlobalGet
                     (this->builder,
                      (Name)(this->stackBase->super_Importable).super_Named.name.super_IString.str,
                      (Type)(this->stackBase->type).id);
  local_40 = Builder::makeBinary(pBVar2,BVar4,(Expression *)left,(Expression *)pGVar6);
  this_00 = this->builder;
  BVar4 = Abstract::getBinary((Type)(this->stackPointer->type).id,LtU);
  local_44 = index;
  pLVar7 = Builder::makeLocalGet(this->builder,index,(Type)(this->stackPointer->type).id);
  pGVar6 = Builder::makeGlobalGet
                     (this->builder,
                      (Name)(this->stackLimit->super_Importable).super_Named.name.super_IString.str,
                      (Type)(this->stackLimit->type).id);
  pBVar8 = Builder::makeBinary(this_00,BVar4,(Expression *)pLVar7,(Expression *)pGVar6);
  pBVar8 = Builder::makeBinary(pBVar2,OrInt32,(Expression *)local_40,(Expression *)pBVar8);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_R8.id;
  any = Builder::makeIf(pBVar2,(Expression *)pBVar8,(Expression *)local_50,(Expression *)0x0,type);
  pBVar2 = this->builder;
  name = (this->stackPointer->super_Importable).super_Named.name.super_IString.str;
  pLVar7 = Builder::makeLocalGet(pBVar2,local_44,(Type)(this->stackPointer->type).id);
  append = Builder::makeGlobalSet(pBVar2,(Name)name,(Expression *)pLVar7);
  pBVar9 = Builder::blockify(this->builder,(Expression *)any,(Expression *)append);
  return (Expression *)pBVar9;
}

Assistant:

Expression* stackBoundsCheck(Function* func, Expression* value) {
    // Add a local to store the value of the expression. We need the value
    // twice: once to check if it has overflowed, and again to assign to store
    // it.
    auto newSP = Builder::addVar(func, stackPointer->type);
    // If we imported a handler, call it. That can show a nice error in JS.
    // Otherwise, just trap.
    Expression* handlerExpr;
    if (handler.is()) {
      handlerExpr =
        builder.makeCall(handler,
                         {builder.makeLocalGet(newSP, stackPointer->type)},
                         stackPointer->type);
    } else {
      handlerExpr = builder.makeUnreachable();
    }

    // If it is >= the base or <= the limit, then error.
    auto check = builder.makeIf(
      builder.makeBinary(
        BinaryOp::OrInt32,
        builder.makeBinary(
          Abstract::getBinary(stackPointer->type, Abstract::GtU),
          builder.makeLocalTee(newSP, value, stackPointer->type),
          builder.makeGlobalGet(stackBase->name, stackBase->type)),
        builder.makeBinary(
          Abstract::getBinary(stackPointer->type, Abstract::LtU),
          builder.makeLocalGet(newSP, stackPointer->type),
          builder.makeGlobalGet(stackLimit->name, stackLimit->type))),
      handlerExpr);
    // (global.set $__stack_pointer (local.get $newSP))
    auto newSet = builder.makeGlobalSet(
      stackPointer->name, builder.makeLocalGet(newSP, stackPointer->type));
    return builder.blockify(check, newSet);
  }